

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<std::pair<slang::ast::ValueSymbol_const*,slang::ast::Expression_const*>>::
emplaceRealloc<std::pair<slang::ast::ValueSymbol_const*,slang::ast::Expression_const*>>
          (SmallVectorBase<std::pair<slang::ast::ValueSymbol_const*,slang::ast::Expression_const*>>
           *this,pointer pos,
          pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*> *args)

{
  ulong uVar1;
  pointer p;
  Expression *pEVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  pointer ppVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  
  if (*(long *)(this + 8) == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar9 = *(long *)(this + 8) + 1;
  uVar1 = *(ulong *)(this + 0x10);
  if (uVar9 < uVar1 * 2) {
    uVar9 = uVar1 * 2;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    uVar9 = 0x7ffffffffffffff;
  }
  lVar7 = (long)pos - *(long *)this;
  puVar3 = (undefined8 *)operator_new(uVar9 << 4);
  pEVar2 = args->second;
  *(undefined8 *)((long)puVar3 + lVar7) = args->first;
  ((undefined8 *)((long)puVar3 + lVar7))[1] = pEVar2;
  p = *(pointer *)this;
  lVar8 = *(long *)(this + 8);
  lVar6 = (long)p + (lVar8 * 0x10 - (long)pos);
  ppVar5 = p;
  puVar4 = puVar3;
  if (lVar6 == 0) {
    if (lVar8 != 0) {
      do {
        pEVar2 = ppVar5->second;
        *puVar4 = ppVar5->first;
        puVar4[1] = pEVar2;
        ppVar5 = ppVar5 + 1;
        puVar4 = puVar4 + 2;
      } while (ppVar5 != pos);
    }
  }
  else {
    for (; ppVar5 != pos; ppVar5 = ppVar5 + 1) {
      pEVar2 = ppVar5->second;
      *puVar4 = ppVar5->first;
      puVar4[1] = pEVar2;
      puVar4 = puVar4 + 2;
    }
    memcpy((void *)((long)puVar3 + lVar7 + 0x10),pos,(lVar6 - 0x10U & 0xfffffffffffffff0) + 0x10);
  }
  if (p != (pointer)(this + 0x18)) {
    operator_delete(p);
    lVar8 = *(long *)(this + 8);
  }
  *(long *)(this + 8) = lVar8 + 1;
  *(ulong *)(this + 0x10) = uVar9;
  *(undefined8 **)this = puVar3;
  return (pointer)((long)puVar3 + lVar7);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}